

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_CheckAddressNetType_bitcoin_Test::TestBody
          (AddressFactory_CheckAddressNetType_bitcoin_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_3a0;
  AssertHelper local_398;
  AssertionResult gtest_ar__14;
  AddressFactory factory;
  Address local_350;
  Script script;
  Pubkey pubkey;
  Address addr;
  
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            (&factory,kMainnet,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &addr);
  std::__cxx11::string::string
            ((string *)&addr,"027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",
             (allocator *)&local_350);
  cfd::core::Pubkey::Pubkey(&pubkey,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  cfd::core::Address::Address(&addr);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x150,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&script,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  script._vptr_Script._0_1_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)script._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x151,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x152,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x153,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x154,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x155,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x156,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x157,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&script,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x159,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&script,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&script);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  script._vptr_Script._0_1_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (!(bool)script._vptr_Script._0_1_) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15a,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15b,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15c,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15d,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15e,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x15f,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  script._vptr_Script._0_1_ = !bVar1;
  script.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__14);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&script,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x160,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&gtest_ar__14);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__14);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&script.script_data_);
  std::__cxx11::string::string
            ((string *)&local_350,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",
             (allocator *)&gtest_ar__14);
  cfd::core::Script::Script(&script,(string *)&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x163,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x164,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x165,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x166,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x167,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x168,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x169,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x16a,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x16c,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x16d,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x16e,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x16f,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x170,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x171,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x172,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x173,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)&local_350,kTestnet,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar__14);
  cfd::AddressFactory::operator=(&factory,(AddressFactory *)&local_350);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)&local_350);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar__14);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x176,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x177,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x178,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x179,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x17a,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x17b,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x17c,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x17d,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x17f,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x180,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x181,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x182,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x183,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x184,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x185,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x186,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x188,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x189,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x18a,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x18b,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x18c,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x18d,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x18e,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,399,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x191,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x192,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x193,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x194,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x195,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x196,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x197,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x198,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)&local_350,kRegtest,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar__14);
  cfd::AddressFactory::operator=(&factory,(AddressFactory *)&local_350);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)&local_350);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar__14);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x19b,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x19c,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x19d,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x19e,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x19f,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a0,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a1,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a2,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress(&local_350,&factory,&pubkey);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a4,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a5,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a6,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a7,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a8,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1a9,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1aa,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ab,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ad,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ae,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1af,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b0,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b1,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b2,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b3,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b4,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress(&local_350,&factory,&script);
      cfd::core::Address::operator=(&addr,&local_350);
      cfd::core::Address::~Address(&local_350);
    }
  }
  else {
    testing::Message::Message((Message *)&local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__14,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b6,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__14,(Message *)&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__14);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_350);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kMainnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b7,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kTestnet);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b8,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  gtest_ar__14.success_ = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kRegtest);
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__14.success_) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1b9,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kLiquidV1);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ba,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kElementsRegtest);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1bb,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1bc,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  bVar1 = cfd::AddressFactory::CheckAddressNetType(&factory,&addr,kCustomChain);
  gtest_ar__14.success_ = !bVar1;
  gtest_ar__14.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_350,(internal *)&gtest_ar__14,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1bd,(char *)local_350._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_350);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__14.message_);
  cfd::core::Script::~Script(&script);
  cfd::core::Address::~Address(&addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_bitcoin)
{
  AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kTestnet, GetBitcoinAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kRegtest, GetBitcoinAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}